

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

CPU embree::getCPUModel(void)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t DisplayFamily_DisplayModel;
  uint32_t DisplayModel;
  uint32_t DisplayFamily;
  uint32_t extended_model_ID;
  uint32_t model_ID;
  uint32_t extended_family_ID;
  uint32_t family_ID;
  int out [4];
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  uint local_80;
  uint local_7c;
  string local_48 [32];
  CPU local_28;
  
  getCPUVendor_abi_cxx11_();
  bVar2 = std::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_48);
  if (bVar2) {
    local_28 = UNKNOWN;
  }
  else {
    piVar1 = (int *)cpuid_basic_info(0);
    if (*piVar1 < 1) {
      local_28 = UNKNOWN;
    }
    else {
      piVar1 = (int *)cpuid_Version_info(1);
      iVar4 = *piVar1;
      uVar3 = iVar4 >> 8 & 0xf;
      local_80 = iVar4 >> 4 & 0xf;
      local_7c = uVar3;
      if (uVar3 == 0xf) {
        local_7c = (iVar4 >> 0x14 & 0xffU) + 0xf;
      }
      if ((uVar3 == 6) || (uVar3 == 0xf)) {
        local_80 = (iVar4 >> 0x10 & 0xfU) * 0x10 + local_80;
      }
      iVar4 = local_7c * 0x100 + local_80;
      if (iVar4 == 0x67d) {
        local_28 = CORE_ICE_LAKE;
      }
      else if (iVar4 == 0x67e) {
        local_28 = CORE_ICE_LAKE;
      }
      else if (iVar4 == 0x68c) {
        local_28 = CORE_TIGER_LAKE;
      }
      else if (iVar4 == 0x6a5) {
        local_28 = CORE_COMET_LAKE;
      }
      else if (iVar4 == 0x6a6) {
        local_28 = CORE_COMET_LAKE;
      }
      else if (iVar4 == 0x666) {
        local_28 = CORE_CANNON_LAKE;
      }
      else if (iVar4 == 0x68e) {
        local_28 = CORE_KABY_LAKE;
      }
      else if (iVar4 == 0x69e) {
        local_28 = CORE_KABY_LAKE;
      }
      else if (iVar4 == 0x66a) {
        local_28 = XEON_ICE_LAKE;
      }
      else if (iVar4 == 0x66c) {
        local_28 = XEON_ICE_LAKE;
      }
      else if (iVar4 == 0x655) {
        local_28 = XEON_SKY_LAKE;
      }
      else if (iVar4 == 0x64e) {
        local_28 = CORE_SKY_LAKE;
      }
      else if (iVar4 == 0x65e) {
        local_28 = CORE_SKY_LAKE;
      }
      else if (iVar4 == 0x656) {
        local_28 = XEON_BROADWELL;
      }
      else if (iVar4 == 0x64f) {
        local_28 = XEON_BROADWELL;
      }
      else if (iVar4 == 0x647) {
        local_28 = CORE_BROADWELL;
      }
      else if (iVar4 == 0x63d) {
        local_28 = CORE_BROADWELL;
      }
      else if (iVar4 == 0x63f) {
        local_28 = XEON_HASWELL;
      }
      else if (iVar4 == 0x63c) {
        local_28 = CORE_HASWELL;
      }
      else if (iVar4 == 0x645) {
        local_28 = CORE_HASWELL;
      }
      else if (iVar4 == 0x646) {
        local_28 = CORE_HASWELL;
      }
      else if (iVar4 == 0x63e) {
        local_28 = XEON_IVY_BRIDGE;
      }
      else if (iVar4 == 0x63a) {
        local_28 = CORE_IVY_BRIDGE;
      }
      else if (iVar4 == 0x62d) {
        local_28 = SANDY_BRIDGE;
      }
      else if (iVar4 == 0x62f) {
        local_28 = SANDY_BRIDGE;
      }
      else if (iVar4 == 0x62a) {
        local_28 = SANDY_BRIDGE;
      }
      else if (iVar4 == 0x62e) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x625) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x62c) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x61e) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x61f) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x61a) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x61d) {
        local_28 = NEHALEM;
      }
      else if (iVar4 == 0x617) {
        local_28 = CORE2;
      }
      else if (iVar4 == 0x60f) {
        local_28 = CORE2;
      }
      else if (iVar4 == 0x60e) {
        local_28 = CORE1;
      }
      else if (iVar4 == 0x685) {
        local_28 = XEON_PHI_KNIGHTS_MILL;
      }
      else if (iVar4 == 0x657) {
        local_28 = XEON_PHI_KNIGHTS_LANDING;
      }
      else {
        local_28 = UNKNOWN;
      }
    }
  }
  return local_28;
}

Assistant:

CPU getCPUModel() 
  {
#if defined(__X86_ASM__)
    if (getCPUVendor() != "GenuineIntel")
      return CPU::UNKNOWN;
    
    int out[4];
    __cpuid(out, 0);
    if (out[0] < 1) return CPU::UNKNOWN;
    __cpuid(out, 1);

    /* please see CPUID documentation for these formulas */
    uint32_t family_ID          = (out[0] >>  8) & 0x0F;
    uint32_t extended_family_ID = (out[0] >> 20) & 0xFF;
    
    uint32_t model_ID           = (out[0] >>  4) & 0x0F;
    uint32_t extended_model_ID  = (out[0] >> 16) & 0x0F;
    
    uint32_t DisplayFamily = family_ID;
    if (family_ID == 0x0F)
      DisplayFamily += extended_family_ID;
    
    uint32_t DisplayModel = model_ID;
    if (family_ID == 0x06 || family_ID == 0x0F)
      DisplayModel += extended_model_ID << 4;

    uint32_t DisplayFamily_DisplayModel = (DisplayFamily << 8) + (DisplayModel << 0);

    // Data from Intel® 64 and IA-32 Architectures, Volume 4, Chapter 2, Table 2-1 (CPUID Signature Values of DisplayFamily_DisplayModel)
    if (DisplayFamily_DisplayModel == 0x067D) return CPU::CORE_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x067E) return CPU::CORE_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x068C) return CPU::CORE_TIGER_LAKE;
    if (DisplayFamily_DisplayModel == 0x06A5) return CPU::CORE_COMET_LAKE;
    if (DisplayFamily_DisplayModel == 0x06A6) return CPU::CORE_COMET_LAKE;
    if (DisplayFamily_DisplayModel == 0x0666) return CPU::CORE_CANNON_LAKE;
    if (DisplayFamily_DisplayModel == 0x068E) return CPU::CORE_KABY_LAKE;
    if (DisplayFamily_DisplayModel == 0x069E) return CPU::CORE_KABY_LAKE;
    if (DisplayFamily_DisplayModel == 0x066A) return CPU::XEON_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x066C) return CPU::XEON_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x0655) return CPU::XEON_SKY_LAKE;
    if (DisplayFamily_DisplayModel == 0x064E) return CPU::CORE_SKY_LAKE;
    if (DisplayFamily_DisplayModel == 0x065E) return CPU::CORE_SKY_LAKE;
    if (DisplayFamily_DisplayModel == 0x0656) return CPU::XEON_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x064F) return CPU::XEON_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x0647) return CPU::CORE_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x063D) return CPU::CORE_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x063F) return CPU::XEON_HASWELL;
    if (DisplayFamily_DisplayModel == 0x063C) return CPU::CORE_HASWELL;
    if (DisplayFamily_DisplayModel == 0x0645) return CPU::CORE_HASWELL;
    if (DisplayFamily_DisplayModel == 0x0646) return CPU::CORE_HASWELL;
    if (DisplayFamily_DisplayModel == 0x063E) return CPU::XEON_IVY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x063A) return CPU::CORE_IVY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062D) return CPU::SANDY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062F) return CPU::SANDY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062A) return CPU::SANDY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062E) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x0625) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x062C) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061E) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061F) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061A) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061D) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x0617) return CPU::CORE2;
    if (DisplayFamily_DisplayModel == 0x060F) return CPU::CORE2;
    if (DisplayFamily_DisplayModel == 0x060E) return CPU::CORE1;

    if (DisplayFamily_DisplayModel == 0x0685) return CPU::XEON_PHI_KNIGHTS_MILL;
    if (DisplayFamily_DisplayModel == 0x0657) return CPU::XEON_PHI_KNIGHTS_LANDING;
    
#elif defined(__ARM_NEON)
    return CPU::ARM;
#endif
    
    return CPU::UNKNOWN;
  }